

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O2

inputs_t allocateInputs(picnic_instance_t *params)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  inputs_t ppuVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  
  bVar2 = params->input_output_size;
  uVar3 = params->num_rounds;
  ppuVar4 = (inputs_t)calloc(1,((ulong)bVar2 + 8) * (ulong)uVar3);
  lVar5 = (ulong)uVar3 << 3;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    puVar1 = (uint8_t *)((long)ppuVar4 + lVar5);
    lVar5 = lVar5 + (ulong)bVar2;
    ppuVar4[uVar6] = puVar1;
  }
  return ppuVar4;
}

Assistant:

inputs_t allocateInputs(const picnic_instance_t* params) {
  uint8_t* slab = calloc(1, params->num_rounds * (params->input_output_size + sizeof(uint8_t*)));

  inputs_t inputs = (uint8_t**)slab;

  slab += params->num_rounds * sizeof(uint8_t*);

  for (uint32_t i = 0; i < params->num_rounds; i++) {
    inputs[i] = (uint8_t*)slab;
    slab += params->input_output_size;
  }

  return inputs;
}